

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_export_raw
              (mbedtls_rsa_context *ctx,uchar *N,size_t N_len,uchar *P,size_t P_len,uchar *Q,
              size_t Q_len,uchar *D,size_t D_len,uchar *E,size_t E_len)

{
  int iVar1;
  bool bVar2;
  int local_44;
  int is_priv;
  int ret;
  uchar *Q_local;
  size_t P_len_local;
  uchar *P_local;
  size_t N_len_local;
  uchar *N_local;
  mbedtls_rsa_context *ctx_local;
  
  local_44 = 0;
  iVar1 = mbedtls_mpi_cmp_int(&ctx->N,0);
  bVar2 = false;
  if (iVar1 != 0) {
    iVar1 = mbedtls_mpi_cmp_int(&ctx->P,0);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = mbedtls_mpi_cmp_int(&ctx->Q,0);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = mbedtls_mpi_cmp_int(&ctx->D,0);
        bVar2 = false;
        if (iVar1 != 0) {
          iVar1 = mbedtls_mpi_cmp_int(&ctx->E,0);
          bVar2 = iVar1 != 0;
        }
      }
    }
  }
  if ((bVar2) || (((P == (uchar *)0x0 && (Q == (uchar *)0x0)) && (D == (uchar *)0x0)))) {
    if ((((((N == (uchar *)0x0) ||
           (local_44 = mbedtls_mpi_write_binary(&ctx->N,N,N_len), local_44 == 0)) &&
          ((P == (uchar *)0x0 ||
           (local_44 = mbedtls_mpi_write_binary(&ctx->P,P,P_len), local_44 == 0)))) &&
         ((Q == (uchar *)0x0 ||
          (local_44 = mbedtls_mpi_write_binary(&ctx->Q,Q,Q_len), local_44 == 0)))) &&
        ((D == (uchar *)0x0 || (local_44 = mbedtls_mpi_write_binary(&ctx->D,D,D_len), local_44 == 0)
         ))) && (E != (uchar *)0x0)) {
      local_44 = mbedtls_mpi_write_binary(&ctx->E,E,E_len);
    }
    ctx_local._4_4_ = local_44;
  }
  else {
    ctx_local._4_4_ = -0x4080;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_export_raw( const mbedtls_rsa_context *ctx,
                            unsigned char *N, size_t N_len,
                            unsigned char *P, size_t P_len,
                            unsigned char *Q, size_t Q_len,
                            unsigned char *D, size_t D_len,
                            unsigned char *E, size_t E_len )
{
    int ret = 0;
    int is_priv;
    RSA_VALIDATE_RET( ctx != NULL );

    /* Check if key is private or public */
    is_priv =
        mbedtls_mpi_cmp_int( &ctx->N, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->P, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->Q, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->D, 0 ) != 0 &&
        mbedtls_mpi_cmp_int( &ctx->E, 0 ) != 0;

    if( !is_priv )
    {
        /* If we're trying to export private parameters for a public key,
         * something must be wrong. */
        if( P != NULL || Q != NULL || D != NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    }

    if( N != NULL )
        MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &ctx->N, N, N_len ) );

    if( P != NULL )
        MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &ctx->P, P, P_len ) );

    if( Q != NULL )
        MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &ctx->Q, Q, Q_len ) );

    if( D != NULL )
        MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &ctx->D, D, D_len ) );

    if( E != NULL )
        MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &ctx->E, E, E_len ) );

cleanup:

    return( ret );
}